

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.hxx
# Opt level: O0

void __thiscall
Plot::Plot(Plot *this,string *function,string *name,string *xlabel,string *ylabel,string *zlabel,
          int mode,int lineStyle,int lineWidth)

{
  string *zlabel_local;
  string *ylabel_local;
  string *xlabel_local;
  string *name_local;
  string *function_local;
  Plot *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->sName);
  std::__cxx11::string::string((string *)&this->sXLabel);
  std::__cxx11::string::string((string *)&this->sYLabel);
  std::__cxx11::string::string((string *)&this->sZLabel);
  std::__cxx11::string::string((string *)&this->sUserSettings);
  std::__cxx11::string::string((string *)&this->sUsedDimensions);
  std::__cxx11::string::operator=((string *)this,(string *)function);
  std::__cxx11::string::operator=((string *)&this->sName,(string *)name);
  std::__cxx11::string::operator=((string *)&this->sXLabel,(string *)xlabel);
  std::__cxx11::string::operator=((string *)&this->sYLabel,(string *)ylabel);
  std::__cxx11::string::operator=((string *)&this->sZLabel,(string *)zlabel);
  this->nMode = mode;
  this->nLineStyle = lineStyle;
  this->nLineWidth = lineWidth;
  return;
}

Assistant:

Plot(string function, string name, string xlabel, string ylabel, string zlabel, int mode, int lineStyle=0, int lineWidth=0) {
		sFunction = function;
		sName = name;
		sXLabel = xlabel;
		sYLabel = ylabel;
		sZLabel = zlabel;
		nMode = mode;
		nLineStyle = lineStyle;
        nLineWidth = lineWidth;
	}